

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::NewScObjectNoArg(Var instance,ScriptContext *requestContext)

{
  code *pcVar1;
  anon_class_24_3_52a5356e implicitCall;
  bool bVar2;
  Attributes AVar3;
  BOOL BVar4;
  ThreadContext *pTVar5;
  FunctionInfo *functionInfo_00;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  JavascriptLibrary *pJVar8;
  DynamicType *pDVar9;
  JavascriptFunction *pJVar10;
  ConstructorCache *pCVar11;
  ScriptContext *pSVar12;
  DynamicObject *this;
  JavascriptFunction *local_148;
  ThreadContext *local_140;
  JavascriptProxy *local_128;
  DynamicObject *newDynamicObject;
  JavascriptFunction *function;
  ConstructorCache *constructorCache;
  Var returnVar;
  ThreadContext *threadContext;
  Var newObject;
  ScriptContext *scriptContext_1;
  JavascriptFunction *constructor_1;
  DynamicType *newArrayType;
  JavascriptArray *newArray;
  JavascriptLibrary *library_1;
  ScriptContext *scriptContext;
  JavascriptFunction *constructor;
  DynamicType *newObjectType;
  DynamicObject *newObject_1;
  JavascriptLibrary *library;
  RecyclableObject *object;
  FunctionInfo *functionInfo;
  Arguments AStack_70;
  ScriptContext *local_60;
  CallInfo local_58;
  undefined1 local_50 [8];
  Arguments args;
  Var dummy;
  JavascriptProxy *proxy;
  ScriptContext *requestContext_local;
  Var instance_local;
  
  bVar2 = VarIs<Js::JavascriptProxy>(instance);
  if (bVar2) {
    local_128 = UnsafeVarTo<Js::JavascriptProxy>(instance);
  }
  else {
    local_128 = (JavascriptProxy *)0x0;
  }
  if (local_128 == (JavascriptProxy *)0x0) {
    functionInfo_00 = GetConstructorFunctionInfo(instance,requestContext);
    pRVar6 = VarTo<Js::RecyclableObject>(instance);
    if (functionInfo_00 == (FunctionInfo *)JavascriptObject::EntryInfo::NewInstance) {
      AVar3 = FunctionInfo::GetAttributes((FunctionInfo *)JavascriptObject::EntryInfo::NewInstance);
      if ((AVar3 & ErrorOnNew) != None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18c1,
                                    "((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0)"
                                    ,
                                    "(functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pJVar8 = RecyclableObject::GetLibrary(pRVar6);
      newObjectType = (DynamicType *)JavascriptLibrary::CreateObject(pJVar8,true,0);
      bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
      if (bVar2) {
        pRVar6 = Js::JavascriptProxy::AutoProxyWrapper(newObjectType);
        newObjectType = (DynamicType *)VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar6);
      }
      pDVar9 = DynamicObject::GetDynamicType((DynamicObject *)newObjectType);
      bVar2 = DynamicType::GetIsShared(pDVar9);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18cf,"(newObjectType->GetIsShared())",
                                    "newObjectType->GetIsShared()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pJVar10 = VarTo<Js::JavascriptFunction>(instance);
      pCVar11 = JavascriptFunction::GetConstructorCache(pJVar10);
      bVar2 = ConstructorCache::NeedsUpdateAfterCtor(pCVar11);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18d2,
                                    "(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor())",
                                    "!constructor->GetConstructorCache()->NeedsUpdateAfterCtor()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pSVar12 = JavascriptLibrary::GetScriptContext(pJVar8);
      if (pSVar12 != requestContext) {
        CrossSite::MarshalDynamicObjectAndPrototype(requestContext,(DynamicObject *)newObjectType);
      }
      instance_local = newObjectType;
    }
    else if (functionInfo_00 == (FunctionInfo *)Js::JavascriptArray::EntryInfo::NewInstance) {
      AVar3 = FunctionInfo::GetAttributes
                        ((FunctionInfo *)Js::JavascriptArray::EntryInfo::NewInstance);
      if ((AVar3 & ErrorOnNew) != None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18df,
                                    "((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0)"
                                    ,
                                    "(functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pJVar8 = RecyclableObject::GetLibrary(pRVar6);
      newArrayType = (DynamicType *)JavascriptLibrary::CreateArray(pJVar8);
      bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
      if (bVar2) {
        newArrayType = (DynamicType *)Js::JavascriptProxy::AutoProxyWrapper(newArrayType);
      }
      pDVar9 = DynamicObject::GetDynamicType((DynamicObject *)newArrayType);
      bVar2 = DynamicType::GetIsShared(pDVar9);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18ed,"(newArrayType->GetIsShared())",
                                    "newArrayType->GetIsShared()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pJVar10 = VarTo<Js::JavascriptFunction>(instance);
      pCVar11 = JavascriptFunction::GetConstructorCache(pJVar10);
      bVar2 = ConstructorCache::NeedsUpdateAfterCtor(pCVar11);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18f0,
                                    "(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor())",
                                    "!constructor->GetConstructorCache()->NeedsUpdateAfterCtor()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pSVar12 = JavascriptLibrary::GetScriptContext(pJVar8);
      if (pSVar12 != requestContext) {
        CrossSite::MarshalDynamicObjectAndPrototype(requestContext,(DynamicObject *)newArrayType);
      }
      instance_local = newArrayType;
    }
    else {
      if (functionInfo_00 == (FunctionInfo *)0x0) {
        local_140 = (ThreadContext *)NewScObjectHostDispatchOrProxy(pRVar6,requestContext);
      }
      else {
        local_140 = (ThreadContext *)NewScObjectCommon(pRVar6,functionInfo_00,requestContext,false);
      }
      threadContext = local_140;
      pSVar12 = RecyclableObject::GetScriptContext(pRVar6);
      pTVar5 = ScriptContext::GetThreadContext(pSVar12);
      implicitCall.object = pRVar6;
      implicitCall.threadContext = pTVar5;
      implicitCall.newObject = local_140;
      pTVar5 = (ThreadContext *)
               ThreadContext::
               ExecuteImplicitCall<Js::JavascriptOperators::NewScObjectNoArg(void*,Js::ScriptContext*)::__1>
                         (pTVar5,pRVar6,ImplicitCall_Accessor,implicitCall);
      BVar4 = IsObject(pTVar5);
      if (BVar4 != 0) {
        threadContext = pTVar5;
      }
      function = (JavascriptFunction *)0x0;
      bVar2 = VarIs<Js::JavascriptFunction>(instance);
      if (bVar2) {
        local_148 = UnsafeVarTo<Js::JavascriptFunction>(instance);
      }
      else {
        local_148 = (JavascriptFunction *)0x0;
      }
      if (local_148 != (JavascriptFunction *)0x0) {
        function = (JavascriptFunction *)JavascriptFunction::GetConstructorCache(local_148);
      }
      if ((function != (JavascriptFunction *)0x0) &&
         (bVar2 = ConstructorCache::NeedsUpdateAfterCtor((ConstructorCache *)function), bVar2)) {
        UpdateNewScObjectCache(pRVar6,threadContext,requestContext);
      }
      bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
      if (bVar2) {
        pRVar6 = Js::JavascriptProxy::AutoProxyWrapper(threadContext);
        this = VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar6);
        pSVar12 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
        threadContext = (ThreadContext *)CrossSite::MarshalVar(requestContext,this,pSVar12);
      }
      instance_local = threadContext;
    }
  }
  else {
    args.Values = (Type)0x0;
    CallInfo::CallInfo(&local_58,CallFlags_New,1);
    Arguments::Arguments((Arguments *)local_50,local_58,&args.Values);
    pTVar5 = ScriptContext::GetThreadContext(requestContext);
    functionInfo = (FunctionInfo *)local_128;
    Arguments::Arguments(&AStack_70,(Arguments *)local_50);
    local_60 = requestContext;
    instance_local =
         ThreadContext::
         ExecuteImplicitCall<Js::JavascriptOperators::NewScObjectNoArg(void*,Js::ScriptContext*)::__0>
                   (pTVar5,(RecyclableObject *)local_128,ImplicitCall_Accessor,
                    (anon_class_32_3_16037d12 *)&functionInfo);
  }
  return instance_local;
}

Assistant:

Var JavascriptOperators::NewScObjectNoArg(Var instance, ScriptContext * requestContext)
    {
        JIT_HELPER_REENTRANT_HEADER(NewScObjectNoArg);
        JavascriptProxy * proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(instance);
        if (proxy)
        {
            Var dummy = nullptr;
            Arguments args(CallInfo(CallFlags_New, 1), &dummy);
            return requestContext->GetThreadContext()->ExecuteImplicitCall(proxy, Js::ImplicitCall_Accessor, [=]()->Js::Var
            {
                return proxy->ConstructorTrap(args, requestContext, 0);
            });
        }

        FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(instance, requestContext);
        RecyclableObject * object = VarTo<RecyclableObject>(instance);

        if (functionInfo == &JavascriptObject::EntryInfo::NewInstance)
        {
            // Fast path for new Object()
            Assert((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0);
            JavascriptLibrary* library = object->GetLibrary();

            DynamicObject * newObject = library->CreateObject(true);
            JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newObject));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
            {
                newObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
            }
#endif

#if DBG
            DynamicType* newObjectType = newObject->GetDynamicType();
            Assert(newObjectType->GetIsShared());

            JavascriptFunction* constructor = VarTo<JavascriptFunction>(instance);
            Assert(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor());
#endif

            ScriptContext * scriptContext = library->GetScriptContext();
            if (scriptContext != requestContext)
            {
                CrossSite::MarshalDynamicObjectAndPrototype(requestContext, newObject);
            }

            return newObject;
        }
        else if (functionInfo == &JavascriptArray::EntryInfo::NewInstance)
        {
            Assert((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0);
            JavascriptLibrary* library = object->GetLibrary();

            JavascriptArray * newArray = library->CreateArray();
            JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newArray));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
            {
                newArray = static_cast<JavascriptArray*>(JavascriptProxy::AutoProxyWrapper(newArray));
            }
#endif

#if DBG
            DynamicType* newArrayType = newArray->GetDynamicType();
            Assert(newArrayType->GetIsShared());

            JavascriptFunction* constructor = VarTo<JavascriptFunction>(instance);
            Assert(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor());
#endif

            ScriptContext * scriptContext = library->GetScriptContext();
            if (scriptContext != requestContext)
            {
                CrossSite::MarshalDynamicObjectAndPrototype(requestContext, newArray);
            }
            return newArray;
        }

        Var newObject = functionInfo != nullptr ?
            JavascriptOperators::NewScObjectCommon(object, functionInfo, requestContext) :
            JavascriptOperators::NewScObjectHostDispatchOrProxy(object, requestContext);

        ThreadContext * threadContext = object->GetScriptContext()->GetThreadContext();
        Var returnVar = threadContext->ExecuteImplicitCall(object, Js::ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, object, CallInfo(CallFlags_New, 1), newObject);
        });
        if (JavascriptOperators::IsObject(returnVar))
        {
            newObject = returnVar;
        }

        ConstructorCache * constructorCache = nullptr;
        JavascriptFunction *function = JavascriptOperators::TryFromVar<JavascriptFunction>(instance);
        if (function)
        {
            constructorCache = function->GetConstructorCache();
        }

        if (constructorCache != nullptr && constructorCache->NeedsUpdateAfterCtor())
        {
            JavascriptOperators::UpdateNewScObjectCache(object, newObject, requestContext);
        }

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            DynamicObject* newDynamicObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
            // this might come from a different scriptcontext.
            newObject = CrossSite::MarshalVar(requestContext, newDynamicObject, newDynamicObject->GetScriptContext());
        }
#endif

        return newObject;
        JIT_HELPER_END(NewScObjectNoArg);
    }